

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void __thiscall
v_hashmap<substring,_unsigned_long>::double_size(v_hashmap<substring,_unsigned_long> *this)

{
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> *__range2;
  long lVar1;
  hash_elem *phVar2;
  hash_elem *e;
  hash_elem *phVar3;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem> tmp;
  
  tmp.end_array = (hash_elem *)0x0;
  tmp.erase_count = 0;
  tmp._begin = (hash_elem *)0x0;
  tmp._end = (hash_elem *)0x0;
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize(&tmp,this->num_occupants + 10);
  phVar2 = (this->dat)._begin;
  lVar1 = -(long)phVar2;
  for (; phVar2 != (this->dat).end_array; phVar2 = phVar2 + 1) {
    if (phVar2->occupied == true) {
      v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::push_back(&tmp,phVar2);
    }
    lVar1 = lVar1 + -0x28;
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::resize
            (&this->dat,(-(long)(&((this->dat)._begin)->occupied + lVar1) / 0x28) * 2);
  phVar2 = (this->dat)._begin;
  memset(phVar2,0,(long)(this->dat).end_array - (long)phVar2);
  phVar2 = tmp._end;
  for (phVar3 = tmp._begin; phVar3 != phVar2; phVar3 = phVar3 + 1) {
    get(this,&phVar3->key,phVar3->hash);
    put_after_get_nogrow(this,&phVar3->key,phVar3->hash,&phVar3->val);
  }
  v_array<v_hashmap<substring,_unsigned_long>::hash_elem>::delete_v(&tmp);
  return;
}

Assistant:

void double_size()
  {  //    printf("doubling size!\n");
    // remember the old occupants
    v_array<hash_elem> tmp = v_array<hash_elem>();
    tmp.resize(num_occupants + 10);
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
      if (e->occupied)
        tmp.push_back(*e);

    // double the size and clear
    // std::cerr<<"doubling to "<<(base_size()*2) << " units == " << (base_size()*2*sizeof(hash_elem)) << " bytes / " <<
    // ((size_t)-1)<<std::endl;
    dat.resize(base_size() * 2);
    memset(dat.begin(), 0, base_size() * sizeof(hash_elem));

    // re-insert occupants
    for (auto& e : tmp)
    {
      get(e.key, e.hash);
      //      std::cerr << "reinserting " << e->key << " at " << last_position << std::endl;
      put_after_get_nogrow(e.key, e.hash, e.val);
    }
    tmp.delete_v();
  }